

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGforStageCreation.cpp
# Opt level: O2

void __thiscall
BGforStageCreation::Fill_jaI_Array
          (BGforStageCreation *this,PlanningUnitMADPDiscrete *pu,Index ts,Index *joIs,
          shared_ptr<const_JointPolicyDiscretePure> *jpolPrevTs,Index *jaI_arr)

{
  Index IVar1;
  Index johI;
  ulong uVar2;
  
  johI = 0;
  for (uVar2 = 0; ts != uVar2; uVar2 = uVar2 + 1) {
    IVar1 = (*(jpolPrevTs->px->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                      (jpolPrevTs->px,(ulong)johI);
    jaI_arr[uVar2] = IVar1;
    johI = PlanningUnitMADPDiscrete::GetSuccessorJOHI(pu,johI,joIs[uVar2]);
  }
  return;
}

Assistant:

void BGforStageCreation::Fill_jaI_Array(
        const PlanningUnitMADPDiscrete* pu,
        Index ts, 
        Index joIs[], //the array of joint observations issued 
        const boost::shared_ptr<const JointPolicyDiscretePure> &jpolPrevTs, 
        Index* jaI_arr
        )
{
    Index johI = 0;
    Index t = 0;
    while(t < ts)
    {
        Index ja = jpolPrevTs->GetJointActionIndex(johI);
        jaI_arr[t] = ja;

        Index next_joI = joIs[t];
        johI = pu->GetSuccessorJOHI(johI, next_joI);
        t++;
    }
}